

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void * rw::imageOpen(void *object,int32 offset,int32 size)

{
  undefined8 *puVar1;
  ImageGlobals *g;
  int32 size_local;
  int32 offset_local;
  void *object_local;
  
  puVar1 = (undefined8 *)(engine + offset);
  imageModuleOffset = offset;
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 1) = 0;
  *(undefined4 *)(puVar1 + 0x20) = 0;
  return object;
}

Assistant:

static void*
imageOpen(void *object, int32 offset, int32 size)
{
	imageModuleOffset = offset;
	ImageGlobals *g = PLUGINOFFSET(ImageGlobals, engine, imageModuleOffset);
	g->searchPaths = nil;
	g->numSearchPaths = 0;
	g->numFileFormats = 0;
	return object;
}